

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  uchar *size;
  pointer lexer_00;
  pointer log_stream;
  pointer pMVar3;
  ulong uVar4;
  char *str;
  OutputBuffer *buffer;
  pointer line_finder_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string_view filename_00;
  string local_150;
  undefined1 local_130 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_118;
  string local_108;
  Enum local_e8;
  Enum local_e4;
  undefined1 local_e0 [8];
  MemoryStream stream;
  undefined1 local_ad [8];
  ValidateOptions options;
  undefined1 local_96 [8];
  WastParseOptions parse_wast_options;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  Errors errors;
  string_view local_60;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_50;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  char *local_40;
  Result local_34;
  undefined1 local_30 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  wabt::string_view::string_view((string_view *)&lexer,s_infile);
  filename.size_ = (size_type)local_30;
  filename.data_ = local_40;
  local_34 = wabt::ReadFile((wabt *)lexer._M_t.
                                    super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                                    .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,
                            filename,in_RCX);
  wabt::string_view::string_view(&local_60,s_infile);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  filename_00.size_ = (size_type)local_60.data_;
  filename_00.data_ = (char *)&local_50;
  wabt::WastLexer::CreateBufferLexer(filename_00,(void *)local_60.size_,(size_t)size);
  bVar1 = wabt::Failed(local_34);
  if (bVar1) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module);
  std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
  unique_ptr<std::default_delete<wabt::Module>,void>
            ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
             &parse_wast_options.features.multi_value_enabled_);
  wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_96,&s_features);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_50)
  ;
  options.features._5_4_ =
       wabt::ParseWatModule
                 (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                           &parse_wast_options.features.multi_value_enabled_,(Errors *)&module,
                  (WastParseOptions *)local_96);
  options.features._9_4_ = options.features._5_4_;
  local_34 = (Result)options.features._5_4_;
  bVar1 = wabt::Succeeded((Result)options.features._5_4_);
  if ((bVar1) && ((s_validate & 1U) != 0)) {
    wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_ad,&s_features);
    pMVar3 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                       ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                        &parse_wast_options.features.multi_value_enabled_);
    stream.buf_._M_t.
    super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
    super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
    super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ =
         wabt::ValidateModule(pMVar3,(Errors *)&module,(ValidateOptions *)local_ad);
    local_34 = stream.buf_._M_t.
               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_;
  }
  stream.buf_._M_t.
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._0_4_ = local_34.enum_;
  bVar1 = wabt::Succeeded(local_34);
  if (bVar1) {
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::MemoryStream::MemoryStream((MemoryStream *)local_e0,&log_stream->super_Stream);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    pMVar3 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                       ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                        &parse_wast_options.features.multi_value_enabled_);
    local_e8 = (Enum)wabt::WriteBinaryModule((Stream *)local_e0,pMVar3,&s_write_binary_options);
    local_e4 = local_e8;
    local_34 = (Result)local_e8;
    bVar1 = wabt::Succeeded((Result)local_e8);
    if (bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        wabt::string_view::string_view((string_view *)&local_118,s_infile);
        DefaultOuputName_abi_cxx11_(&local_108,(string_view)local_118);
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
      }
      str = (char *)std::__cxx11::string::c_str();
      wabt::string_view::string_view((string_view *)&line_finder,str);
      buffer = wabt::MemoryStream::output_buffer((MemoryStream *)local_e0);
      WriteBufferToFile(_line_finder,buffer);
    }
    wabt::MemoryStream::~MemoryStream((MemoryStream *)local_e0);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_50);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_130);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_130);
  file = _stderr;
  std::__cxx11::string::string((string *)&local_150);
  wabt::FormatErrorsToFile((Errors *)&module,Text,line_finder_00,(FILE *)file,&local_150,Never,0x50)
  ;
  std::__cxx11::string::~string((string *)&local_150);
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_34);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_130);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
             &parse_wast_options.features.multi_value_enabled_);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&module);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}